

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O2

EGLImageKHR __thiscall deqp::egl::anon_unknown_0::TestContext::createEGLImage(TestContext *this)

{
  GLuint GVar1;
  int iVar2;
  deUint32 err;
  GLenum err_00;
  Library *pLVar3;
  undefined4 extraout_var;
  GLuint sourceTexture;
  EGLint attribList [3];
  
  GVar1 = anon_unknown_5::createTexture(&this->m_gl,&this->m_config);
  sourceTexture = GVar1;
  pLVar3 = EglTestContext::getLibrary(this->m_testCtx);
  attribList[2] = 0x3038;
  attribList[0] = 0x30bc;
  attribList[1] = 0;
  iVar2 = (*pLVar3->_vptr_Library[8])
                    (pLVar3,this->m_eglDisplay,this->m_eglContext,0x30b1,(ulong)GVar1);
  err = (*pLVar3->_vptr_Library[0x1f])(pLVar3);
  eglu::checkError(err,"eglCreateImageKHR()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                   ,0x25d);
  (*(this->m_gl).deleteTextures)(1,&sourceTexture);
  err_00 = (*(this->m_gl).getError)();
  glu::checkError(err_00,"eglCreateImageKHR()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharedRenderingPerfTests.cpp"
                  ,0x260);
  return (EGLImageKHR)CONCAT44(extraout_var,iVar2);
}

Assistant:

EGLImageKHR TestContext::createEGLImage (void)
{
	GLuint sourceTexture = createTexture(m_gl, m_config);

	try
	{
		const Library&	egl				= m_testCtx.getLibrary();
		const EGLint	attribList[]	=
		{
			EGL_GL_TEXTURE_LEVEL_KHR, 0,
			EGL_NONE
		};

		EGLImageKHR image = egl.createImageKHR(m_eglDisplay, m_eglContext, EGL_GL_TEXTURE_2D_KHR, (EGLClientBuffer)(deUintptr)sourceTexture, attribList);
		EGLU_CHECK_MSG(egl, "eglCreateImageKHR()");

		m_gl.deleteTextures(1, &sourceTexture);
		GLU_EXPECT_NO_ERROR(m_gl.getError(), "eglCreateImageKHR()");

		return image;
	}
	catch (...)
	{
		m_gl.deleteTextures(1, &sourceTexture);
		throw;
	}
}